

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O1

bool __thiscall glslang::TProgram::crossStageCheck(TProgram *this,EShMessages messages)

{
  TIntermediate *pTVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  TVector<glslang::TIntermediate_*> activeStages;
  TIntermAggregate root;
  TIntermAggregate uniformObjects;
  TIntermediate uniforms;
  TPoolAllocator *local_b58;
  TIntermediate **ppTStack_b50;
  iterator local_b48;
  TIntermediate **ppTStack_b40;
  TIntermAggregate *local_b30;
  undefined1 local_b28 [304];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
  *local_9f8;
  TIntermAggregate local_9a0;
  TIntermediate local_818;
  
  local_b48._M_current = (TIntermediate **)0x0;
  ppTStack_b40 = (TIntermediate **)0x0;
  local_b58 = (TPoolAllocator *)0x0;
  ppTStack_b50 = (TIntermediate **)0x0;
  local_b58 = GetThreadPoolAllocator();
  ppTStack_b50 = (TIntermediate **)0x0;
  local_b48._M_current = (TIntermediate **)0x0;
  ppTStack_b40 = (TIntermediate **)0x0;
  lVar4 = 0;
  do {
    pTVar1 = *(TIntermediate **)((long)this->intermediate + lVar4);
    if (pTVar1 != (TIntermediate *)0x0) {
      if (local_b48._M_current == ppTStack_b40) {
        std::vector<glslang::TIntermediate*,glslang::pool_allocator<glslang::TIntermediate*>>::
        _M_realloc_insert<glslang::TIntermediate*const&>
                  ((vector<glslang::TIntermediate*,glslang::pool_allocator<glslang::TIntermediate*>>
                    *)&local_b58,local_b48,(TIntermediate **)((long)this->intermediate + lVar4));
      }
      else {
        *local_b48._M_current = pTVar1;
        local_b48._M_current = local_b48._M_current + 1;
      }
    }
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x70);
  bVar8 = true;
  if (8 < (ulong)((long)local_b48._M_current - (long)ppTStack_b50)) {
    pTVar1 = *ppTStack_b50;
    TIntermediate::TIntermediate(&local_818,EShLangCount,pTVar1->version,pTVar1->profile);
    TIntermediate::setSpv(&local_818,&pTVar1->spvVersion);
    TIntermAggregate::TIntermAggregate(&local_9a0,EOpLinkerObjects);
    TIntermAggregate::TIntermAggregate((TIntermAggregate *)local_b28,EOpSequence);
    local_b30 = &local_9a0;
    std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::emplace_back<TIntermNode*>
              ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)(local_b28 + 0xc0),
               (TIntermNode **)&local_b30);
    local_818.treeRoot = (TIntermNode *)local_b28;
    if (local_b48._M_current != ppTStack_b50) {
      uVar2 = 0;
      uVar5 = 1;
      do {
        TIntermediate::mergeUniformObjects(&local_818,this->infoSink,ppTStack_b50[uVar2]);
        bVar8 = uVar5 < (ulong)((long)local_b48._M_current - (long)ppTStack_b50 >> 3);
        uVar2 = uVar5;
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (bVar8);
    }
    if (local_b48._M_current != ppTStack_b50) {
      uVar2 = 0;
      uVar5 = 1;
      do {
        TIntermediate::mergeGlobalUniformBlocks(ppTStack_b50[uVar2],this->infoSink,&local_818,true);
        bVar8 = uVar5 < (ulong)((long)local_b48._M_current - (long)ppTStack_b50 >> 3);
        uVar2 = uVar5;
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (bVar8);
    }
    uVar7 = local_818.numErrors;
    if (8 < (ulong)((long)local_b48._M_current - (long)ppTStack_b50)) {
      uVar2 = 1;
      uVar6 = 2;
      do {
        uVar3 = uVar6 - 2;
        TIntermediate::checkStageIO(ppTStack_b50[uVar3],this->infoSink,ppTStack_b50[uVar2]);
        uVar2 = (ulong)uVar6;
        uVar6 = uVar6 + 1;
        uVar7 = (uint)(uVar7 != 0 || ppTStack_b50[uVar3]->numErrors != 0);
      } while (uVar2 < (ulong)((long)local_b48._M_current - (long)ppTStack_b50 >> 3));
    }
    bVar8 = uVar7 == 0;
    if (((messages >> 0x12 & 1) != 0) &&
       (8 < (ulong)((long)local_b48._M_current - (long)ppTStack_b50))) {
      uVar2 = 1;
      uVar7 = 2;
      do {
        TIntermediate::optimizeStageIO(ppTStack_b50[uVar7 - 2],this->infoSink,ppTStack_b50[uVar2]);
        uVar2 = (ulong)uVar7;
        uVar7 = uVar7 + 1;
      } while (uVar2 < (ulong)((long)local_b48._M_current - (long)ppTStack_b50 >> 3));
    }
    local_b28._0_8_ = &PTR_getLoc_00b10030;
    if (local_9f8 !=
        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
         *)0x0) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
      ::_M_erase(local_9f8,
                 (_Link_type)(local_9f8->_M_impl).super__Rb_tree_header._M_header._M_parent);
    }
    local_9a0.super_TIntermOperator.super_TIntermTyped.super_TIntermNode._vptr_TIntermNode =
         (_func_int **)&PTR_getLoc_00b10030;
    if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
         *)local_9a0.pragmaTable !=
        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
         *)0x0) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
      ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                  *)local_9a0.pragmaTable,
                 (_Link_type)
                 (((_Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_true>
                    *)&(local_9a0.pragmaTable)->
                       super_TMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                  )->super__Rb_tree_header)._M_header._M_parent);
    }
    TIntermediate::~TIntermediate(&local_818);
  }
  return bVar8;
}

Assistant:

bool TProgram::crossStageCheck(EShMessages messages) {

    // make temporary intermediates to hold the linkage symbols for each linking interface
    // while we do the checks
    // Independent interfaces are:
    //                  all uniform variables and blocks
    //                  all buffer blocks
    //                  all in/out on a stage boundary

    TVector<TIntermediate*> activeStages;
    for (int s = 0; s < EShLangCount; ++s) {
        if (intermediate[s])
            activeStages.push_back(intermediate[s]);
    }

    // no extra linking if there is only one stage
    if (! (activeStages.size() > 1))
        return true;

    // setup temporary tree to hold unfirom objects from different stages
    TIntermediate* firstIntermediate = activeStages.front();
    TIntermediate uniforms(EShLangCount,
                           firstIntermediate->getVersion(),
                           firstIntermediate->getProfile());
    uniforms.setSpv(firstIntermediate->getSpv());

    TIntermAggregate uniformObjects(EOpLinkerObjects);
    TIntermAggregate root(EOpSequence);
    root.getSequence().push_back(&uniformObjects);
    uniforms.setTreeRoot(&root);

    bool error = false;

    // merge uniforms from all stages into a single intermediate
    for (unsigned int i = 0; i < activeStages.size(); ++i) {
        uniforms.mergeUniformObjects(*infoSink, *activeStages[i]);
    }
    error |= uniforms.getNumErrors() != 0;

    // copy final definition of global block back into each stage
    for (unsigned int i = 0; i < activeStages.size(); ++i) {
        // We only want to merge into already existing global uniform blocks.
        // A stage that doesn't already know about the global doesn't care about it's content.
        // Otherwise we end up pointing to the same object between different stages
        // and that will break binding/set remappings
        bool mergeExistingOnly = true;
        activeStages[i]->mergeGlobalUniformBlocks(*infoSink, uniforms, mergeExistingOnly);
    }

    // compare cross stage symbols for each stage boundary
    for (unsigned int i = 1; i < activeStages.size(); ++i) {
        activeStages[i - 1]->checkStageIO(*infoSink, *activeStages[i]);
        error |= (activeStages[i - 1]->getNumErrors() != 0);
    }

    // if requested, optimize cross stage IO
    if (messages & EShMsgLinkTimeOptimization) {
        for (unsigned int i = 1; i < activeStages.size(); ++i) {
            activeStages[i - 1]->optimizeStageIO(*infoSink, *activeStages[i]);
        }
    }

    return !error;
}